

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O0

int Cortex_CopyFrame(sFrameOfData *pSrc,sFrameOfData *pDst)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  int nAngleEncoderSamples;
  int nAngleEncoders;
  int nForceSamples;
  int nForcePlates;
  int nSamples;
  int nChannels;
  sAnalogData *DstAnalog;
  sAnalogData *SrcAnalog;
  int size;
  void *ptr;
  int n;
  sBodyData *DstBody;
  sBodyData *SrcBody;
  int nBodies;
  int iBody;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar6;
  int local_1c;
  
  iVar6 = in_RDI[2];
  *in_RSI = *in_RDI;
  in_RSI[2] = iVar6;
  for (local_1c = 0; local_1c < iVar6; local_1c = local_1c + 1) {
    lVar4 = (long)local_1c;
    lVar5 = (long)local_1c;
    iVar2 = in_RDI[lVar4 * 0x30 + 0x24];
    iVar1 = iVar2 * 0xc;
    if (in_RSI[lVar5 * 0x30 + 0x24] != iVar2) {
      pvVar3 = realloc(*(void **)(in_RSI + lVar5 * 0x30 + 0x26),(long)iVar1);
      if ((0 < iVar1) && (pvVar3 == (void *)0x0)) {
        Cortex_FreeFrame((sFrameOfData *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        return 5;
      }
      in_RSI[lVar5 * 0x30 + 0x24] = iVar2;
      *(void **)(in_RSI + lVar5 * 0x30 + 0x26) = pvVar3;
    }
    memcpy(*(void **)(in_RSI + lVar5 * 0x30 + 0x26),*(void **)(in_RDI + lVar4 * 0x30 + 0x26),
           (long)iVar1);
    iVar2 = in_RDI[lVar4 * 0x30 + 0x29];
    iVar1 = iVar2 * 0x38;
    if (in_RSI[lVar5 * 0x30 + 0x29] != iVar2) {
      pvVar3 = realloc(*(void **)(in_RSI + lVar5 * 0x30 + 0x2a),(long)iVar1);
      if ((0 < iVar1) && (pvVar3 == (void *)0x0)) {
        Cortex_FreeFrame((sFrameOfData *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        return 5;
      }
      in_RSI[lVar5 * 0x30 + 0x29] = iVar2;
      *(void **)(in_RSI + lVar5 * 0x30 + 0x2a) = pvVar3;
    }
    memcpy(*(void **)(in_RSI + lVar5 * 0x30 + 0x2a),*(void **)(in_RDI + lVar4 * 0x30 + 0x2a),
           (long)iVar1);
    iVar2 = in_RDI[lVar4 * 0x30 + 0x2c];
    iVar1 = iVar2 << 3;
    if (in_RSI[lVar5 * 0x30 + 0x2c] != iVar2) {
      pvVar3 = realloc(*(void **)(in_RSI + lVar5 * 0x30 + 0x2e),(long)iVar1);
      if ((0 < iVar1) && (pvVar3 == (void *)0x0)) {
        Cortex_FreeFrame((sFrameOfData *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        return 5;
      }
      in_RSI[lVar5 * 0x30 + 0x2c] = iVar2;
      *(void **)(in_RSI + lVar5 * 0x30 + 0x2e) = pvVar3;
    }
    memcpy(*(void **)(in_RSI + lVar5 * 0x30 + 0x2e),*(void **)(in_RDI + lVar4 * 0x30 + 0x2e),
           (long)iVar1);
    in_RSI[lVar5 * 0x30 + 0x30] = in_RDI[lVar4 * 0x30 + 0x30];
    in_RSI[lVar5 * 0x30 + 0x31] = in_RDI[lVar4 * 0x30 + 0x31];
    in_RSI[lVar5 * 0x30 + 0x32] = in_RDI[lVar4 * 0x30 + 0x32];
    in_RSI[lVar5 * 0x30 + 0x33] = in_RDI[lVar4 * 0x30 + 0x33];
  }
  iVar6 = in_RDI[0x12c4];
  iVar2 = iVar6 * 0xc;
  if (in_RSI[0x12c4] != iVar6) {
    pvVar3 = realloc(*(void **)(in_RSI + 0x12c6),(long)iVar2);
    if ((0 < iVar2) && (pvVar3 == (void *)0x0)) {
      Cortex_FreeFrame((sFrameOfData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      );
      return 5;
    }
    in_RSI[0x12c4] = iVar6;
    *(void **)(in_RSI + 0x12c6) = pvVar3;
  }
  memcpy(*(void **)(in_RSI + 0x12c6),*(void **)(in_RDI + 0x12c6),(long)iVar2);
  iVar6 = in_RDI[0x12c8];
  iVar2 = in_RDI[0x12c9];
  iVar1 = iVar6 * iVar2 * 2;
  if ((in_RSI[0x12c8] != iVar6) || (in_RSI[0x12c9] != iVar2)) {
    pvVar3 = realloc(*(void **)(in_RSI + 0x12ca),(long)iVar1);
    if ((0 < iVar1) && (pvVar3 == (void *)0x0)) {
      Cortex_FreeFrame((sFrameOfData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      );
      return 5;
    }
    in_RSI[0x12c8] = iVar6;
    in_RSI[0x12c9] = iVar2;
    *(void **)(in_RSI + 0x12ca) = pvVar3;
  }
  memcpy(*(void **)(in_RSI + 0x12ca),*(void **)(in_RDI + 0x12ca),(long)iVar1);
  iVar6 = in_RDI[0x12cc];
  iVar2 = in_RDI[0x12cd];
  iVar1 = iVar6 * iVar2 * 0x1c;
  if ((in_RSI[0x12cc] != iVar6) || (in_RSI[0x12cd] != iVar2)) {
    pvVar3 = realloc(*(void **)(in_RSI + 0x12ce),(long)iVar1);
    if ((0 < iVar1) && (pvVar3 == (void *)0x0)) {
      Cortex_FreeFrame((sFrameOfData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      );
      return 5;
    }
    in_RSI[0x12cc] = iVar6;
    in_RSI[0x12cd] = iVar2;
    *(void **)(in_RSI + 0x12ce) = pvVar3;
  }
  memcpy(*(void **)(in_RSI + 0x12ce),*(void **)(in_RDI + 0x12ce),(long)iVar1);
  iVar6 = in_RDI[0x12d0];
  iVar2 = in_RDI[0x12d1];
  iVar1 = iVar6 * iVar2 * 8;
  if ((in_RSI[0x12d0] != iVar6) || (in_RSI[0x12d1] != iVar2)) {
    pvVar3 = realloc(*(void **)(in_RSI + 0x12d2),(long)iVar1);
    if ((0 < iVar1) && (pvVar3 == (void *)0x0)) {
      Cortex_FreeFrame((sFrameOfData *)CONCAT44(iVar6,iVar2));
      return 5;
    }
    in_RSI[0x12d0] = iVar6;
    in_RSI[0x12d1] = iVar2;
    *(void **)(in_RSI + 0x12d2) = pvVar3;
  }
  memcpy(*(void **)(in_RSI + 0x12d2),*(void **)(in_RDI + 0x12d2),(long)iVar1);
  return 0;
}

Assistant:

int Cortex_CopyFrame(const sFrameOfData* pSrc, sFrameOfData* pDst)
{
  int iBody;
  int nBodies = pSrc->nBodies;
  const sBodyData* SrcBody;
  sBodyData* DstBody;

  int n;
  void *ptr;
  int size;

  pDst->iFrame = pSrc->iFrame;

  pDst->nBodies = nBodies;

  for (iBody = 0; iBody < nBodies; iBody++) {
    SrcBody = &pSrc->BodyData[iBody];
    DstBody = &pDst->BodyData[iBody];

    // Copy Markers

    n = SrcBody->nMarkers;
    size = n * sizeof(tMarkerData);

    if (DstBody->nMarkers != n) {
      ptr = realloc(DstBody->Markers, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nMarkers = n;
      DstBody->Markers = (tMarkerData*) ptr;
    }

    memcpy(DstBody->Markers, SrcBody->Markers, size);

    // Copy Segments

    n = SrcBody->nSegments;
    size = n * sizeof(tSegmentData);

    if (DstBody->nSegments != n) {
      ptr = realloc(DstBody->Segments, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nSegments = n;
      DstBody->Segments = (tSegmentData*) ptr;
    }

    memcpy(DstBody->Segments, SrcBody->Segments, size);

    // Copy DOFs

    n = SrcBody->nDofs;
    size = n * sizeof(tDofData);

    if (DstBody->nDofs != n) {
      ptr = realloc(DstBody->Dofs, size);
      if (size > 0 && ptr == NULL) {
        Cortex_FreeFrame(pDst);
        return RC_MemoryError;
      }
      DstBody->nDofs = n;
      DstBody->Dofs = (tDofData*) ptr;
    }

    memcpy(DstBody->Dofs, SrcBody->Dofs, size);

    // Copy extra items
    DstBody->fAvgDofResidual = SrcBody->fAvgDofResidual;
    DstBody->nIterations = SrcBody->nIterations;
    DstBody->ZoomEncoderValue = SrcBody->ZoomEncoderValue;
    DstBody->FocusEncoderValue = SrcBody->FocusEncoderValue;
  }

  // Copy Unidentified Markers

  n = pSrc->nUnidentifiedMarkers;
  size = n * sizeof(tMarkerData);

  if (pDst->nUnidentifiedMarkers != n) {
    ptr = realloc(pDst->UnidentifiedMarkers, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    pDst->nUnidentifiedMarkers = n;
    pDst->UnidentifiedMarkers = (tMarkerData*) ptr;
  }

  memcpy(pDst->UnidentifiedMarkers, pSrc->UnidentifiedMarkers, size);

  // Copy Analog

  const sAnalogData* SrcAnalog = &pSrc->AnalogData;
  sAnalogData* DstAnalog = &pDst->AnalogData;

  // Analog Channels

  int nChannels = SrcAnalog->nAnalogChannels;
  int nSamples = SrcAnalog->nAnalogSamples;

  size = nChannels * nSamples * sizeof(short);

  if (DstAnalog->nAnalogChannels != nChannels || DstAnalog->nAnalogSamples
      != nSamples) {
    ptr = realloc(DstAnalog->AnalogSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAnalogChannels = nChannels;
    DstAnalog->nAnalogSamples = nSamples;
    DstAnalog->AnalogSamples = (short*) ptr;
  }

  memcpy(DstAnalog->AnalogSamples, SrcAnalog->AnalogSamples, size);

  // Forces Data

  int nForcePlates = SrcAnalog->nForcePlates;
  int nForceSamples = SrcAnalog->nForceSamples;

  size = nForcePlates * nForceSamples * sizeof(tForceData);

  if (DstAnalog->nForcePlates != nForcePlates || DstAnalog->nForceSamples
      != nForceSamples) {
    ptr = realloc(DstAnalog->Forces, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nForcePlates = nForcePlates;
    DstAnalog->nForceSamples = nForceSamples;
    DstAnalog->Forces = (tForceData*) ptr;
  }

  memcpy(DstAnalog->Forces, SrcAnalog->Forces, size);

  int nAngleEncoders = SrcAnalog->nAngleEncoders;
  int nAngleEncoderSamples = SrcAnalog->nAngleEncoderSamples;

  size = nAngleEncoders * nAngleEncoderSamples * sizeof(double);

  if (DstAnalog->nAngleEncoders != nAngleEncoders
      || DstAnalog->nAngleEncoderSamples != nAngleEncoderSamples) {
    ptr = realloc(DstAnalog->AngleEncoderSamples, size);
    if (size > 0 && ptr == NULL) {
      Cortex_FreeFrame(pDst);
      return RC_MemoryError;
    }
    DstAnalog->nAngleEncoders = nAngleEncoders;
    DstAnalog->nAngleEncoderSamples = nAngleEncoderSamples;
    DstAnalog->AngleEncoderSamples = (double*) ptr;
  }

  memcpy(DstAnalog->AngleEncoderSamples, SrcAnalog->AngleEncoderSamples, size);

  return RC_Okay;
}